

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalAsOfJoin::ExecuteInternal
          (PhysicalAsOfJoin *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *lstate_p)

{
  byte bVar1;
  JoinType join_type;
  pointer pGVar2;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  if (pGVar2[4]._vptr_GlobalSinkState == (_func_int **)0x0) {
    join_type = (this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                super_CachingPhysicalOperator.field_0x81;
    bVar1 = join_type - RIGHT;
    if ((bVar1 < 9) && ((0x18bU >> (bVar1 & 0x1f) & 1) != 0)) {
      return FINISHED;
    }
    PhysicalComparisonJoin::ConstructEmptyJoinResult
              (join_type,
               (bool)pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size
                     [0x18],input,chunk);
  }
  else {
    AsOfLocalState::ExecuteInternal((AsOfLocalState *)lstate_p,context,input,chunk);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalAsOfJoin::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                     GlobalOperatorState &gstate, OperatorState &lstate_p) const {
	auto &gsink = sink_state->Cast<AsOfGlobalSinkState>();
	auto &lstate = lstate_p.Cast<AsOfLocalState>();

	if (gsink.rhs_sink.count == 0) {
		// empty RHS
		if (!EmptyResultIfRHSIsEmpty()) {
			ConstructEmptyJoinResult(join_type, gsink.has_null, input, chunk);
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			return OperatorResultType::FINISHED;
		}
	}

	return lstate.ExecuteInternal(context, input, chunk);
}